

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

void dump_level_simple(char *basefilename,char *title,chunk_conflict *c)

{
  _Bool _Var1;
  char *leaf;
  ang_file *fo;
  char *pcVar2;
  char path [1024];
  
  pcVar2 = ANGBAND_DIR_USER;
  if (basefilename == (char *)0x0) {
    leaf = "dumpedlevel.html";
  }
  else {
    leaf = format("%s.html",basefilename);
  }
  path_build(path,0x400,pcVar2,leaf);
  fo = file_open(path,MODE_WRITE,FTYPE_TEXT);
  if (fo != (ang_file *)0x0) {
    pcVar2 = "Dumped Level";
    if (title != (char *)0x0) {
      pcVar2 = title;
    }
    dump_level(fo,pcVar2,c,(int **)0x0);
    _Var1 = file_close(fo);
    if (_Var1) {
      pcVar2 = "dumpedlevel";
      if (basefilename != (char *)0x0) {
        pcVar2 = basefilename;
      }
      msg("Level dumped to %s.html",pcVar2);
    }
  }
  return;
}

Assistant:

void dump_level_simple(const char *basefilename, const char *title,
	struct chunk *c)
{
	char path[1024];
	ang_file *fo;

	path_build(path, sizeof(path), ANGBAND_DIR_USER, (basefilename) ?
		format("%s.html", basefilename) : "dumpedlevel.html");
	fo = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (fo) {
		dump_level(fo, (title) ? title : "Dumped Level", c, NULL);
		if (file_close(fo)) {
			msg("Level dumped to %s.html",
				(basefilename) ? basefilename : "dumpedlevel");
		}
	}
}